

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::UdpEntrySyntax::setChild(UdpEntrySyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  TokenList *pTVar2;
  logic_error *this_00;
  Token TVar3;
  UdpEdgeIndicatorSyntax *local_168;
  string local_140;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined8 local_68;
  Info *local_60;
  undefined8 local_58;
  Info *local_50;
  undefined8 local_48;
  Info *local_40;
  undefined8 local_38;
  Info *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  UdpEntrySyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  switch(index) {
  case 0:
    pSVar1 = TokenOrSyntax::node(&child);
    pTVar2 = SyntaxNode::as<slang::syntax::TokenList>(pSVar1);
    TokenList::operator=(&this->preInputs,pTVar2);
    break;
  case 1:
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_168 = (UdpEdgeIndicatorSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_168 = SyntaxNode::as<slang::syntax::UdpEdgeIndicatorSyntax>(pSVar1);
    }
    this->edgeIndicator = local_168;
    break;
  case 2:
    pSVar1 = TokenOrSyntax::node(&child);
    pTVar2 = SyntaxNode::as<slang::syntax::TokenList>(pSVar1);
    TokenList::operator=(&this->postInputs,pTVar2);
    break;
  case 3:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar3._0_8_;
    (this->colon1).kind = (undefined2)local_28;
    (this->colon1).field_0x2 = local_28._2_1_;
    (this->colon1).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->colon1).rawLen = local_28._4_4_;
    local_20 = TVar3.info;
    (this->colon1).info = local_20;
    break;
  case 4:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_38 = TVar3._0_8_;
    (this->current).kind = (undefined2)local_38;
    (this->current).field_0x2 = local_38._2_1_;
    (this->current).numFlags = (NumericTokenFlags)local_38._3_1_;
    (this->current).rawLen = local_38._4_4_;
    local_30 = TVar3.info;
    (this->current).info = local_30;
    break;
  case 5:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar3._0_8_;
    (this->colon2).kind = (undefined2)local_48;
    (this->colon2).field_0x2 = local_48._2_1_;
    (this->colon2).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->colon2).rawLen = local_48._4_4_;
    local_40 = TVar3.info;
    (this->colon2).info = local_40;
    break;
  case 6:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_58 = TVar3._0_8_;
    (this->next).kind = (undefined2)local_58;
    (this->next).field_0x2 = local_58._2_1_;
    (this->next).numFlags = (NumericTokenFlags)local_58._3_1_;
    (this->next).rawLen = local_58._4_4_;
    local_50 = TVar3.info;
    (this->next).info = local_50;
    break;
  case 7:
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_68 = TVar3._0_8_;
    (this->semi).kind = (undefined2)local_68;
    (this->semi).field_0x2 = local_68._2_1_;
    (this->semi).numFlags = (NumericTokenFlags)local_68._3_1_;
    (this->semi).rawLen = local_68._4_4_;
    local_60 = TVar3.info;
    (this->semi).info = local_60;
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
               ,&local_109);
    std::operator+(&local_e8,&local_108,":");
    std::__cxx11::to_string(&local_140,0x33d3);
    std::operator+(&local_c8,&local_e8,&local_140);
    std::operator+(&local_a8,&local_c8,": ");
    std::operator+(&local_88,&local_a8,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_88);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

void UdpEntrySyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: preInputs = child.node()->as<TokenList>(); return;
        case 1: edgeIndicator = child.node() ? &child.node()->as<UdpEdgeIndicatorSyntax>() : nullptr; return;
        case 2: postInputs = child.node()->as<TokenList>(); return;
        case 3: colon1 = child.token(); return;
        case 4: current = child.token(); return;
        case 5: colon2 = child.token(); return;
        case 6: next = child.token(); return;
        case 7: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}